

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall
QMdiSubWindowPrivate::setVisible(QMdiSubWindowPrivate *this,WindowStateAction action,bool visible)

{
  uint uVar1;
  Data *pDVar2;
  QObject *pQVar3;
  QWidget *this_00;
  ControlContainer *this_01;
  Data *pDVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  
  pDVar2 = this->actions[action].wp.d;
  if (((pDVar2 != (Data *)0x0) && (*(int *)(pDVar2 + 4) != 0)) &&
     (pQVar3 = this->actions[action].wp.value, pQVar3 != (QObject *)0x0)) {
    QAction::setVisible(SUB81(pQVar3,0));
  }
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pDVar2 = (this->controlContainer).wp.d;
  if (((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) ||
     ((this->controlContainer).wp.value == (QObject *)0x0)) {
    this_01 = (ControlContainer *)operator_new(0x70);
    QMdi::ControlContainer::ControlContainer(this_01,(QMdiSubWindow *)this_00);
    pDVar4 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this_01);
    pDVar2 = (this->controlContainer).wp.d;
    (this->controlContainer).wp.d = pDVar4;
    (this->controlContainer).wp.value = (QObject *)this_01;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar2 = *(int *)pDVar2 + -1;
      UNLOCK();
      if (*(int *)pDVar2 == 0) {
        operator_delete(pDVar2);
      }
    }
  }
  lVar5 = QMetaObject::cast((QObject *)&QMdi::ControllerWidget::staticMetaObject);
  if (lVar5 != 0) {
    if (action == MinimizeAction) {
      uVar6 = 1;
    }
    else if (action == MaximizeAction) {
      uVar6 = 2;
    }
    else {
      if (action != CloseAction) goto LAB_0044e799;
      uVar6 = 4;
    }
    uVar1 = *(uint *)(lVar5 + 0x30);
    uVar7 = uVar1 | uVar6;
    if ((uVar1 & uVar6) != 0) {
      uVar7 = ~uVar6 & uVar1;
    }
    if (!visible) {
      uVar7 = ~uVar6 & uVar1;
    }
    *(uint *)(lVar5 + 0x30) = uVar7;
  }
LAB_0044e799:
  QWidget::update(this_00);
  return;
}

Assistant:

void QMdiSubWindowPrivate::setVisible(WindowStateAction action, bool visible)
{
#ifndef QT_NO_ACTION
    if (actions[action])
        actions[action]->setVisible(visible);
#endif

    Q_Q(QMdiSubWindow);
    if (!controlContainer)
        controlContainer = new ControlContainer(q);

    if (ControllerWidget *ctrlWidget = qobject_cast<ControllerWidget *>
                                       (controlContainer->controllerWidget())) {
        ctrlWidget->setControlVisible(action, visible);
    }
    q->update();
}